

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

void __thiscall Datetime::Datetime(Datetime *this)

{
  time_t tVar1;
  
  this->_date = 0;
  this->_year = 0;
  this->_month = 0;
  this->_week = 0;
  this->_weekday = 0;
  this->_julian = 0;
  this->_day = 0;
  this->_seconds = 0;
  this->_offset = 0;
  this->_utc = false;
  this->_weekday = weekstart;
  this->_date = 0;
  this->_julian = 0;
  this->_day = 0;
  this->_seconds = 0;
  this->_offset = 0;
  this->_utc = false;
  tVar1 = time((time_t *)0x0);
  this->_date = tVar1;
  return;
}

Assistant:

Datetime::Datetime ()
{
  clear ();
  _date = time (nullptr);
}